

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void Lowerer::InsertDecUInt32PreventOverflow
               (Opnd *dst,Opnd *src,Instr *insertBeforeInstr,Instr **onOverflowInsertBeforeInstrRef)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *target;
  StackSym *sym;
  RegOpnd *opnd;
  IntConstOpnd *pIVar4;
  LabelInstr *target_00;
  undefined1 local_58 [8];
  AutoReuseOpnd autoReuseTempOpnd;
  
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3f6e,"(dst)","dst");
    if (!bVar2) goto LAB_005e5f42;
    *puVar3 = 0;
  }
  if (dst->m_type != TyUint32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3f6f,"(dst->GetType() == TyUint32)","dst->GetType() == TyUint32");
    if (!bVar2) goto LAB_005e5f42;
    *puVar3 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3f70,"(src)","src");
    if (!bVar2) goto LAB_005e5f42;
    *puVar3 = 0;
  }
  if (src->m_type != TyUint32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3f71,"(src->GetType() == TyUint32)","src->GetType() == TyUint32");
    if (!bVar2) goto LAB_005e5f42;
    *puVar3 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3f72,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
LAB_005e5f42:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  func = insertBeforeInstr->m_func;
  autoReuseTempOpnd._16_8_ = insertBeforeInstr;
  target = InsertLabel(false,insertBeforeInstr);
  sym = StackSym::New(TyUint32,func);
  opnd = IR::RegOpnd::New(sym,TyUint32,func);
  local_58 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_58,&opnd->super_Opnd,func,true);
  pIVar4 = IR::IntConstOpnd::New(1,TyUint32,func,true);
  InsertSub(true,&opnd->super_Opnd,src,&pIVar4->super_Opnd,&target->super_Instr);
  InsertBranch(BrLt_A,true,target,&target->super_Instr);
  InsertMove(dst,&opnd->super_Opnd,&target->super_Instr,true);
  bVar2 = IR::Opnd::IsEqual(dst,src);
  if (onOverflowInsertBeforeInstrRef != (Instr **)0x0 || !bVar2) {
    target_00 = InsertLabel(false,(Instr *)autoReuseTempOpnd._16_8_);
    InsertBranch(Br,false,target_00,&target->super_Instr);
    if (!bVar2) {
      pIVar4 = IR::IntConstOpnd::New(0,TyUint32,func,true);
      InsertMove(dst,&pIVar4->super_Opnd,&target_00->super_Instr,true);
    }
    if (onOverflowInsertBeforeInstrRef != (Instr **)0x0) {
      *onOverflowInsertBeforeInstrRef = &target_00->super_Instr;
    }
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_58);
  return;
}

Assistant:

void Lowerer::InsertDecUInt32PreventOverflow(
    IR::Opnd *const dst,
    IR::Opnd *const src,
    IR::Instr *const insertBeforeInstr,
    IR::Instr * *const onOverflowInsertBeforeInstrRef)
{
    Assert(dst);
    Assert(dst->GetType() == TyUint32);
    Assert(src);
    Assert(src->GetType() == TyUint32);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    // Generate:
    //     subs temp, src, 1
    //     bcs $overflow
    //     mov dst, temp
    //     b $continue
    //   $overflow:
    //     mov dst, 0
    //   $continue:

    IR::LabelInstr *const overflowLabel = Lowerer::InsertLabel(false, insertBeforeInstr);

    //     subs temp, src, 1
    IR::RegOpnd *const tempOpnd = IR::RegOpnd::New(StackSym::New(TyUint32, func), TyUint32, func);
    const IR::AutoReuseOpnd autoReuseTempOpnd(tempOpnd, func);
    Lowerer::InsertSub(true, tempOpnd, src, IR::IntConstOpnd::New(1, TyUint32, func, true), overflowLabel);

    //     bcs $overflow
    Lowerer::InsertBranch(Js::OpCode::BrLt_A, true, overflowLabel, overflowLabel);

    //     mov dst, temp
    Lowerer::InsertMove(dst, tempOpnd, overflowLabel);

    const bool dstEqualsSrc = dst->IsEqual(src);
    if(!dstEqualsSrc || onOverflowInsertBeforeInstrRef)
    {
        //     b $continue
        //   $overflow:
        //     mov dst, 0
        //   $continue:
        IR::LabelInstr *const continueLabel = Lowerer::InsertLabel(false, insertBeforeInstr);
        Lowerer::InsertBranch(Js::OpCode::Br, continueLabel, overflowLabel);
        if(!dstEqualsSrc)
        {
            Lowerer::InsertMove(dst, IR::IntConstOpnd::New(0, TyUint32, func, true), continueLabel);
        }

        if(onOverflowInsertBeforeInstrRef)
        {
            *onOverflowInsertBeforeInstrRef = continueLabel;
        }
    }
    else
    {
        //   $overflow:
    }
}